

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void test_qpixl_util_ilog2<unsigned_long>(void)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_168;
  Message local_160;
  int local_154;
  size_t local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_6;
  Message local_130;
  int local_124;
  size_t local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_5;
  Message local_100;
  int local_f4;
  size_t local_f0;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_4;
  Message local_d0;
  int local_c4;
  size_t local_c0;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_3;
  Message local_a0;
  int local_94;
  size_t local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_2;
  Message local_70;
  int local_64;
  size_t local_60;
  undefined1 local_58 [8];
  AssertionResult gtest_ar_1;
  Message local_40 [3];
  int local_24;
  size_t local_20;
  undefined1 local_18 [8];
  AssertionResult gtest_ar;
  
  local_20 = qpixl::ilog2(1);
  local_24 = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_18,"qpixl::ilog2( 1)","0",&local_20,&local_24);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_18);
  if (!bVar1) {
    testing::Message::Message(local_40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_18);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/util.cpp"
               ,7,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_18);
  local_60 = qpixl::ilog2(2);
  local_64 = 1;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_58,"qpixl::ilog2( 2)","1",&local_60,&local_64);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/util.cpp"
               ,8,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  local_90 = qpixl::ilog2(4);
  local_94 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_88,"qpixl::ilog2( 4)","2",&local_90,&local_94);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/util.cpp"
               ,9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  local_c0 = qpixl::ilog2(8);
  local_c4 = 3;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_b8,"qpixl::ilog2( 8)","3",&local_c0,&local_c4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/util.cpp"
               ,10,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  local_f0 = qpixl::ilog2(0x10);
  local_f4 = 4;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_e8,"qpixl::ilog2(16)","4",&local_f0,&local_f4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/util.cpp"
               ,0xb,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  local_120 = qpixl::ilog2(0x20);
  local_124 = 5;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_118,"qpixl::ilog2(32)","5",&local_120,&local_124);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/util.cpp"
               ,0xc,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  local_150 = qpixl::ilog2(0x40);
  local_154 = 6;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_148,"qpixl::ilog2(64)","6",&local_150,&local_154);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/test/util.cpp"
               ,0xd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  return;
}

Assistant:

void test_qpixl_util_ilog2() {

  EXPECT_EQ( qpixl::ilog2( 1) , 0 ) ;
  EXPECT_EQ( qpixl::ilog2( 2) , 1 ) ;
  EXPECT_EQ( qpixl::ilog2( 4) , 2 ) ;
  EXPECT_EQ( qpixl::ilog2( 8) , 3 ) ;
  EXPECT_EQ( qpixl::ilog2(16) , 4 ) ;
  EXPECT_EQ( qpixl::ilog2(32) , 5 ) ;
  EXPECT_EQ( qpixl::ilog2(64) , 6 ) ;

}